

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMLSParserImpl::startDocument(DOMLSParserImpl *this)

{
  XMLStringPool *pXVar1;
  XMLScanner *pXVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  XMLCh *pXVar8;
  void *pvVar9;
  undefined8 uVar10;
  DOMNode *pDVar11;
  uint *puVar12;
  undefined4 extraout_var_02;
  DOMDocumentImpl *pDVar13;
  XMLSize_t i;
  ulong uVar14;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher> iter;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> inScopeNS;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (this->fWrapNodesInDocumentFragment == (DOMDocumentFragment *)0x0) {
    AbstractDOMParser::startDocument(&this->super_AbstractDOMParser);
    return;
  }
  iVar4 = (*(this->fWrapNodesInDocumentFragment->super_DOMNode)._vptr_DOMNode[0xc])();
  pDVar13 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar4) + -8);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    pDVar13 = (DOMDocumentImpl *)0x0;
  }
  (this->super_AbstractDOMParser).fDocument = pDVar13;
  pDVar11 = &this->fWrapNodesInDocumentFragment->super_DOMNode;
  (this->super_AbstractDOMParser).fCurrentNode = pDVar11;
  (this->super_AbstractDOMParser).fCurrentParent = pDVar11;
  pDVar13->errorChecking = false;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::ValueHashTableOf
            (&inScopeNS,7,(this->super_AbstractDOMParser).fMemoryManager);
  pDVar11 = this->fWrapNodesContext;
  do {
    if (pDVar11 == (DOMNode *)0x0) {
      ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::
      ValueHashTableOfEnumerator
                (&iter,&inScopeNS,false,(this->super_AbstractDOMParser).fMemoryManager);
      while ((iter.fCurElem != (ValueHashTableBucketElem<unsigned_int> *)0x0 ||
             (iter.fCurHash != (iter.fToEnum)->fHashModulus))) {
        pXVar8 = (XMLCh *)ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::
                          nextElementKey(&iter);
        pXVar2 = (this->super_AbstractDOMParser).fScanner;
        puVar12 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::get
                            (&inScopeNS,pXVar8,XMLPlatformUtils::fgMemoryManager);
        ElemStack::addGlobalPrefix(&pXVar2->fElemStack,pXVar8,*puVar12);
      }
      if (this->fWrapNodesAction == ACTION_REPLACE_CHILDREN) {
        iVar4 = (*this->fWrapNodesContext->_vptr_DOMNode[4])();
        if (iVar4 == 9) {
          pXVar2 = (this->super_AbstractDOMParser).fScanner;
          pDVar13 = (this->super_AbstractDOMParser).fDocument;
          iVar4 = (*(pXVar2->fReaderMgr).super_Locator._vptr_Locator[3])(&pXVar2->fReaderMgr);
          (*(pDVar13->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5d])
                    (pDVar13,CONCAT44(extraout_var_02,iVar4));
          pDVar13 = (this->super_AbstractDOMParser).fDocument;
          pXVar8 = ReaderMgr::getCurrentEncodingStr
                             (&((this->super_AbstractDOMParser).fScanner)->fReaderMgr);
          DOMDocumentImpl::setInputEncoding(pDVar13,pXVar8);
        }
      }
      ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::
      ~ValueHashTableOfEnumerator(&iter);
      ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf(&inScopeNS);
      return;
    }
    iVar4 = (*pDVar11->_vptr_DOMNode[4])(pDVar11);
    if (iVar4 == 1) {
      iVar4 = (*pDVar11->_vptr_DOMNode[0xb])();
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
      uVar14 = 0;
      while( true ) {
        uVar6 = (**(code **)(*plVar5 + 0x28))(plVar5);
        if (uVar6 <= uVar14) break;
        plVar7 = (long *)(**(code **)(*plVar5 + 0x18))(plVar5,uVar14);
        pXVar8 = (XMLCh *)(**(code **)(*plVar7 + 0xb0))(plVar7);
        bVar3 = XMLString::equals(pXVar8,(XMLCh *)XMLUni::fgXMLNSURIName);
        if (bVar3) {
          pvVar9 = (void *)(**(code **)(*plVar7 + 0xc0))(plVar7);
          bVar3 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                            (&inScopeNS,pvVar9);
          if (bVar3) goto LAB_002d858a;
          pvVar9 = (void *)(**(code **)(*plVar7 + 0xc0))(plVar7);
          pXVar1 = ((this->super_AbstractDOMParser).fScanner)->fURIStringPool;
          uVar10 = (**(code **)(*plVar7 + 0x18))(plVar7);
          iter.super_XMLEnumerator<unsigned_int>._vptr_XMLEnumerator._0_4_ =
               (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,uVar10);
          ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                    (&inScopeNS,pvVar9,(uint *)&iter);
        }
        else {
LAB_002d858a:
          pXVar8 = (XMLCh *)(**(code **)(*plVar7 + 0x10))(plVar7);
          bVar3 = XMLString::equals(pXVar8,(XMLCh *)XMLUni::fgXMLNSString);
          if (bVar3) {
            bVar3 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                              (&inScopeNS,&XMLUni::fgZeroLenString);
            if (!bVar3) {
              pXVar1 = ((this->super_AbstractDOMParser).fScanner)->fURIStringPool;
              uVar10 = (**(code **)(*plVar7 + 0x18))(plVar7);
              iter.super_XMLEnumerator<unsigned_int>._vptr_XMLEnumerator._0_4_ =
                   (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,uVar10);
              ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                        (&inScopeNS,&XMLUni::fgZeroLenString,(uint *)&iter);
            }
          }
        }
        uVar14 = uVar14 + 1;
      }
    }
    iVar4 = (*pDVar11->_vptr_DOMNode[5])();
    pDVar11 = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
  } while( true );
}

Assistant:

void DOMLSParserImpl::startDocument()
{
    if(fWrapNodesInDocumentFragment)
    {
        fDocument = (DOMDocumentImpl*)fWrapNodesInDocumentFragment->getOwnerDocument();
        fCurrentParent = fCurrentNode = fWrapNodesInDocumentFragment;
        // set DOM error checking off
        fDocument->setErrorChecking(false);

        // if we have namespaces in scope, push them down to the reader
        ValueHashTableOf<unsigned int> inScopeNS(7, fMemoryManager);
        DOMNode* cursor = fWrapNodesContext;
        while(cursor)
        {
            if(cursor->getNodeType()==DOMNode::ELEMENT_NODE)
            {
                DOMNamedNodeMap* attrs = cursor->getAttributes();
                for(XMLSize_t i=0; i<attrs->getLength(); i++)
                {
                    DOMNode* attr = attrs->item(i);
                    if(XMLString::equals(attr->getNamespaceURI(), XMLUni::fgXMLNSURIName) && !inScopeNS.containsKey(attr->getLocalName()))
                        inScopeNS.put((void*)attr->getLocalName(), fScanner->getURIStringPool()->addOrFind(attr->getNodeValue()));
                    else if(XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString) && !inScopeNS.containsKey(XMLUni::fgZeroLenString))
                        inScopeNS.put((void*)XMLUni::fgZeroLenString, fScanner->getURIStringPool()->addOrFind(attr->getNodeValue()));
                }
            }
            cursor = cursor->getParentNode();
        }
        ValueHashTableOfEnumerator<unsigned int> iter(&inScopeNS, false, fMemoryManager);
        while(iter.hasMoreElements())
        {
            XMLCh* prefix = (XMLCh*)iter.nextElementKey();
            fScanner->addGlobalPrefix(prefix, inScopeNS.get(prefix));
        }

        // in this case the document URI and the input encoding must be propagated to the context document
        if(fWrapNodesAction==ACTION_REPLACE_CHILDREN && fWrapNodesContext->getNodeType()==DOMNode::DOCUMENT_NODE)
        {
            fDocument->setDocumentURI(fScanner->getLocator()->getSystemId());
            fDocument->setInputEncoding(fScanner->getReaderMgr()->getCurrentEncodingStr());
        }
    }
    else
        AbstractDOMParser::startDocument();
}